

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void av1_inter_mode_data_fit(TileDataEnc *tile_data,int rdmult)

{
  int iVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  pdVar3 = &tile_data->inter_mode_rd_models[0].sse_ld_sum;
  lVar4 = 0;
  do {
    if (lVar4 == 0x16) {
      return;
    }
    if ((0x11 < (byte)lVar4) || ((0x30007U >> ((uint)lVar4 & 0x1f) & 1) == 0)) {
      iVar1 = *(int *)(pdVar3 + -5);
      dVar5 = (double)iVar1;
      if (((InterModeRdModel *)(pdVar3 + -0xd))->ready == 1) {
        if (0x3f < iVar1) goto LAB_001e8510;
      }
      else {
        if (((InterModeRdModel *)(pdVar3 + -0xd))->ready == 0) {
          if (iVar1 < 200) goto LAB_001e84af;
          auVar6._8_8_ = dVar5;
          auVar6._0_8_ = dVar5;
          auVar7 = divpd(*(undefined1 (*) [16])(pdVar3 + -4),auVar6);
          dVar8 = auVar7._8_8_;
          *(undefined1 (*) [16])(pdVar3 + -10) = auVar7;
          auVar10 = divpd(*(undefined1 (*) [16])(pdVar3 + -2),auVar6);
          *(undefined1 (*) [16])(pdVar3 + -8) = auVar10;
          pdVar3[-6] = *pdVar3 / dVar5;
        }
        else {
LAB_001e8510:
          auVar7._8_8_ = dVar5;
          auVar7._0_8_ = dVar5;
          auVar7 = divpd(*(undefined1 (*) [16])(pdVar3 + -4),auVar7);
          dVar8 = (pdVar3[-9] * 3.0 + auVar7._8_8_) * 0.25;
          pdVar3[-10] = (pdVar3[-10] * 3.0 + auVar7._0_8_) * 0.25;
          pdVar3[-9] = dVar8;
          auVar2._8_8_ = dVar5;
          auVar2._0_8_ = dVar5;
          auVar7 = divpd(*(undefined1 (*) [16])(pdVar3 + -2),auVar2);
          auVar10._0_8_ = (pdVar3[-8] * 3.0 + auVar7._0_8_) * 0.25;
          auVar10._8_8_ = (pdVar3[-7] * 3.0 + auVar7._8_8_) * 0.25;
          *(undefined1 (*) [16])(pdVar3 + -8) = auVar10;
          pdVar3[-6] = (pdVar3[-6] * 3.0 + *pdVar3 / dVar5) * 0.25;
        }
        dVar9 = auVar10._0_8_;
        dVar5 = auVar10._8_8_;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar5 = (pdVar3[-6] - dVar9 * dVar8) / (dVar5 * dVar5 - dVar9 * dVar9);
        pdVar3[-0xc] = dVar5;
        pdVar3[-0xb] = dVar8 - dVar5 * dVar9;
        ((InterModeRdModel *)(pdVar3 + -0xd))->ready = 1;
        *(int *)(pdVar3 + -5) = 0;
        pdVar3[-4] = 0.0;
        pdVar3[-3] = 0.0;
        pdVar3[-2] = 0.0;
        pdVar3[-1] = 0.0;
        *pdVar3 = 0.0;
      }
    }
LAB_001e84af:
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 0xe;
  } while( true );
}

Assistant:

void av1_inter_mode_data_fit(TileDataEnc *tile_data, int rdmult) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    const int block_idx = inter_mode_data_block_idx(bsize);
    InterModeRdModel *md = &tile_data->inter_mode_rd_models[bsize];
    if (block_idx == -1) continue;
    if ((md->ready == 0 && md->num < 200) || (md->ready == 1 && md->num < 64)) {
      continue;
    } else {
      if (md->ready == 0) {
        md->dist_mean = md->dist_sum / md->num;
        md->ld_mean = md->ld_sum / md->num;
        md->sse_mean = md->sse_sum / md->num;
        md->sse_sse_mean = md->sse_sse_sum / md->num;
        md->sse_ld_mean = md->sse_ld_sum / md->num;
      } else {
        const double factor = 3;
        md->dist_mean =
            (md->dist_mean * factor + (md->dist_sum / md->num)) / (factor + 1);
        md->ld_mean =
            (md->ld_mean * factor + (md->ld_sum / md->num)) / (factor + 1);
        md->sse_mean =
            (md->sse_mean * factor + (md->sse_sum / md->num)) / (factor + 1);
        md->sse_sse_mean =
            (md->sse_sse_mean * factor + (md->sse_sse_sum / md->num)) /
            (factor + 1);
        md->sse_ld_mean =
            (md->sse_ld_mean * factor + (md->sse_ld_sum / md->num)) /
            (factor + 1);
      }

      const double my = md->ld_mean;
      const double mx = md->sse_mean;
      const double dx = sqrt(md->sse_sse_mean);
      const double dxy = md->sse_ld_mean;

      md->a = (dxy - mx * my) / (dx * dx - mx * mx);
      md->b = my - md->a * mx;
      md->ready = 1;

      md->num = 0;
      md->dist_sum = 0;
      md->ld_sum = 0;
      md->sse_sum = 0;
      md->sse_sse_sum = 0;
      md->sse_ld_sum = 0;
    }
    (void)rdmult;
  }
}